

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,ImFontAtlasCustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  bool bVar1;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 *local_28;
  ImVec2 *out_uv_max_local;
  ImVec2 *out_uv_min_local;
  ImFontAtlasCustomRect *rect_local;
  ImFontAtlas *this_local;
  
  bVar1 = false;
  if (0 < this->TexWidth) {
    bVar1 = 0 < this->TexHeight;
  }
  local_28 = out_uv_max;
  out_uv_max_local = out_uv_min;
  out_uv_min_local = (ImVec2 *)rect;
  rect_local = (ImFontAtlasCustomRect *)this;
  if (!bVar1) {
    __assert_fail("TexWidth > 0 && TexHeight > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_draw.cpp"
                  ,0x8c1,
                  "void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect *, ImVec2 *, ImVec2 *) const"
                 );
  }
  bVar1 = ImFontAtlasCustomRect::IsPacked(rect);
  if (!bVar1) {
    __assert_fail("rect->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_draw.cpp"
                  ,0x8c2,
                  "void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect *, ImVec2 *, ImVec2 *) const"
                 );
  }
  ImVec2::ImVec2(&local_30,(float)*(ushort *)&out_uv_min_local->y * (this->TexUvScale).x,
                 (float)*(ushort *)((long)&out_uv_min_local->y + 2) * (this->TexUvScale).y);
  *out_uv_max_local = local_30;
  ImVec2::ImVec2(&local_38,
                 (float)((uint)*(ushort *)&out_uv_min_local->y +
                        (uint)*(ushort *)&out_uv_min_local->x) * (this->TexUvScale).x,
                 (float)((uint)*(ushort *)((long)&out_uv_min_local->y + 2) +
                        (uint)*(ushort *)((long)&out_uv_min_local->x + 2)) * (this->TexUvScale).y);
  *local_28 = local_38;
  return;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max) const
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}